

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

string * __thiscall
testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int n)

{
  string *extraout_RAX;
  ostream *poVar1;
  string *psVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  iVar4 = (int)this;
  if (iVar4 == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "twice";
    pcVar3 = "";
  }
  else {
    if (iVar4 != 1) {
      std::__cxx11::stringstream::stringstream(asStack_198);
      poVar1 = (ostream *)std::ostream::operator<<(local_188,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," times",6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(asStack_198);
      psVar2 = (string *)std::ios_base::~ios_base(local_118);
      return psVar2;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "once";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar3);
  return extraout_RAX;
}

Assistant:

inline internal::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}